

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

void __thiscall
qpdf::Stream::replaceFilterData
          (Stream *this,QPDFObjectHandle *filter,QPDFObjectHandle *decode_parms,size_t length)

{
  bool bVar1;
  QPDFObjectHandle *pQVar2;
  longlong value;
  QPDFObjectHandle local_f0;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  Members *local_30;
  Members *s;
  size_t length_local;
  QPDFObjectHandle *decode_parms_local;
  QPDFObjectHandle *filter_local;
  Stream *this_local;
  
  s = (Members *)length;
  length_local = (size_t)decode_parms;
  decode_parms_local = filter;
  filter_local = (QPDFObjectHandle *)this;
  local_30 = stream(this);
  bVar1 = BaseHandle::operator_cast_to_bool(&decode_parms_local->super_BaseHandle);
  if (bVar1) {
    pQVar2 = &local_30->stream_dict;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"/Filter",&local_51);
    QPDFObjectHandle::replaceKey(pQVar2,&local_50,decode_parms_local);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  bVar1 = BaseHandle::operator_cast_to_bool((BaseHandle *)length_local);
  if (bVar1) {
    pQVar2 = &local_30->stream_dict;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"/DecodeParms",&local_89)
    ;
    QPDFObjectHandle::replaceKey(pQVar2,&local_88,(QPDFObjectHandle *)length_local);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  if (s == (Members *)0x0) {
    QTC::TC("qpdf","QPDF_Stream unknown stream length",0);
    pQVar2 = &local_30->stream_dict;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"/Length",&local_b1);
    QPDFObjectHandle::removeKey(pQVar2,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  else {
    pQVar2 = &local_30->stream_dict;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"/Length",&local_d9);
    value = QIntC::to_longlong<unsigned_long>((unsigned_long *)&s);
    QPDFObjectHandle::newInteger(&local_f0,value);
    QPDFObjectHandle::replaceKey(pQVar2,&local_d8,&local_f0);
    QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  return;
}

Assistant:

void
Stream::replaceFilterData(
    QPDFObjectHandle const& filter, QPDFObjectHandle const& decode_parms, size_t length)
{
    auto s = stream();
    if (filter) {
        s->stream_dict.replaceKey("/Filter", filter);
    }
    if (decode_parms) {
        s->stream_dict.replaceKey("/DecodeParms", decode_parms);
    }
    if (length == 0) {
        QTC::TC("qpdf", "QPDF_Stream unknown stream length");
        s->stream_dict.removeKey("/Length");
    } else {
        s->stream_dict.replaceKey(
            "/Length", QPDFObjectHandle::newInteger(QIntC::to_longlong(length)));
    }
}